

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void * cmGetSource(void *arg,char *name)

{
  string *filename;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmSourceFile *this;
  _Base_ptr p_Var2;
  undefined8 *puVar3;
  _Rb_tree_iterator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_> _Var4;
  _Base_ptr p_Var5;
  pair<std::_Rb_tree_iterator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>,_bool>
  pVar6;
  value_type entry;
  allocator local_59;
  string local_58;
  string *local_38;
  
  std::__cxx11::string::string((string *)&local_58,name,&local_59);
  this = cmMakefile::GetSource((cmMakefile *)arg,&local_58);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (this == (cmSourceFile *)0x0) {
    p_Var5 = (_Base_ptr)0x0;
  }
  else {
    p_Var5 = &cmCPluginAPISourceFiles.
              super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header;
    if (cmCPluginAPISourceFiles.
        super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var5 = &cmCPluginAPISourceFiles.
                super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var2 = cmCPluginAPISourceFiles.
               super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        if (*(cmSourceFile **)(p_Var2 + 1) >= this) {
          p_Var5 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[*(cmSourceFile **)(p_Var2 + 1) < this];
      } while (p_Var2 != (_Base_ptr)0x0);
    }
    _Var4._M_node =
         &cmCPluginAPISourceFiles.
          super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
          ._M_t._M_impl.super__Rb_tree_header._M_header;
    if (((_Rb_tree_header *)p_Var5 !=
         &cmCPluginAPISourceFiles.
          super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
          ._M_t._M_impl.super__Rb_tree_header) &&
       (_Var4._M_node =
             &cmCPluginAPISourceFiles.
              super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header, *(cmSourceFile **)(p_Var5 + 1) <= this)
       ) {
      _Var4._M_node = p_Var5;
    }
    if ((_Rb_tree_header *)_Var4._M_node ==
        &cmCPluginAPISourceFiles.
         super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
         ._M_t._M_impl.super__Rb_tree_header) {
      puVar3 = (undefined8 *)operator_new(0xb0);
      puVar3[1] = puVar3 + 3;
      puVar3[2] = 0;
      *(undefined1 *)(puVar3 + 3) = 0;
      local_38 = (string *)(puVar3 + 5);
      puVar3[5] = puVar3 + 7;
      puVar3[6] = 0;
      *(undefined1 *)(puVar3 + 7) = 0;
      filename = (string *)(puVar3 + 9);
      puVar3[9] = puVar3 + 0xb;
      puVar3[10] = 0;
      *(undefined1 *)(puVar3 + 0xb) = 0;
      puVar3[0xd] = 0;
      puVar3[0xe] = 0;
      puVar3[0xf] = 0;
      *(undefined4 *)(puVar3 + 0x11) = 0;
      puVar3[0x12] = 0;
      puVar3[0x13] = puVar3 + 0x11;
      puVar3[0x14] = puVar3 + 0x11;
      puVar3[0x15] = 0;
      *puVar3 = this;
      cmSourceFile::GetFullPath(this,(string *)0x0);
      std::__cxx11::string::_M_assign((string *)filename);
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_58,filename);
      std::__cxx11::string::operator=((string *)(puVar3 + 1),(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::GetFilenameLastExtension(&local_58,filename);
      std::__cxx11::string::operator=(local_38,(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      local_58._M_dataplus._M_p = (pointer)this;
      local_58._M_string_length = (size_type)puVar3;
      pVar6 = std::
              _Rb_tree<cmSourceFile*,std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>,std::_Select1st<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>>
              ::_M_emplace_unique<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>&>
                        ((_Rb_tree<cmSourceFile*,std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>,std::_Select1st<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>>
                          *)&cmCPluginAPISourceFiles,
                         (pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*> *)&local_58);
      _Var4 = pVar6.first._M_node;
    }
    p_Var5 = _Var4._M_node[1]._M_parent;
  }
  return p_Var5;
}

Assistant:

void CCONV* cmGetSource(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  if (cmSourceFile* rsf = mf->GetSource(name)) {
    // Lookup the proxy source file object for this source.
    cmCPluginAPISourceFileMap::iterator i = cmCPluginAPISourceFiles.find(rsf);
    if (i == cmCPluginAPISourceFiles.end()) {
      // Create a proxy source file object for this source.
      cmCPluginAPISourceFile* sf = new cmCPluginAPISourceFile;
      sf->RealSourceFile = rsf;
      sf->FullPath = rsf->GetFullPath();
      sf->SourceName =
        cmSystemTools::GetFilenameWithoutLastExtension(sf->FullPath);
      sf->SourceExtension =
        cmSystemTools::GetFilenameLastExtension(sf->FullPath);

      // Store the proxy in the map so it can be re-used and deleted later.
      cmCPluginAPISourceFileMap::value_type entry(rsf, sf);
      i = cmCPluginAPISourceFiles.insert(entry).first;
    }
    return (void*)i->second;
  }
  return CM_NULLPTR;
}